

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O3

LY_ERR lyd_diff_find_match(lyd_node *siblings,lyd_node *target,ly_bool defaults,ly_ht **dup_inst_ht,
                          lyd_node **match)

{
  lysc_node *schema;
  LY_ERR LVar1;
  
  schema = target->schema;
  if (schema == (lysc_node *)0x0) {
    LVar1 = lyd_find_sibling_opaq_next(siblings,(char *)target[1].schema,match);
  }
  else if ((schema->nodetype & 0x18) == 0) {
    LVar1 = lyd_find_sibling_val(siblings,schema,(char *)0x0,0,match);
  }
  else {
    LVar1 = lyd_find_sibling_first(siblings,target,match);
  }
  if ((LVar1 == LY_ENOTFOUND) || (LVar1 == LY_SUCCESS)) {
    LVar1 = lyd_dup_inst_next(match,siblings,dup_inst_ht);
    if (LVar1 == LY_SUCCESS) {
      LVar1 = LY_SUCCESS;
      if (((*match != (lyd_node *)0x0) && (defaults == '\0')) && (((*match)->flags & 1) != 0)) {
        *match = (lyd_node *)0x0;
        LVar1 = LY_SUCCESS;
      }
    }
  }
  return LVar1;
}

Assistant:

static LY_ERR
lyd_diff_find_match(const struct lyd_node *siblings, const struct lyd_node *target, ly_bool defaults,
        struct ly_ht **dup_inst_ht, struct lyd_node **match)
{
    LY_ERR r;

    if (!target->schema) {
        /* try to find the same opaque node */
        r = lyd_find_sibling_opaq_next(siblings, LYD_NAME(target), match);
    } else if (target->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) {
        /* try to find the exact instance */
        r = lyd_find_sibling_first(siblings, target, match);
    } else {
        /* try to simply find the node, there cannot be more instances */
        r = lyd_find_sibling_val(siblings, target->schema, NULL, 0, match);
    }
    if (r && (r != LY_ENOTFOUND)) {
        return r;
    }

    /* update match as needed */
    LY_CHECK_RET(lyd_dup_inst_next(match, siblings, dup_inst_ht));

    if (*match && ((*match)->flags & LYD_DEFAULT) && !defaults) {
        /* ignore default nodes */
        *match = NULL;
    }
    return LY_SUCCESS;
}